

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionController *this,
          Txid *txid,uint32_t vout,Amount *amount,Script *locking_script,ByteData *asset_nonce,
          BlindFactor *blind_factor,BlindFactor *entropy,bool is_random_sort,bool is_remove_nonce)

{
  uint32_t tx_in_index;
  ConfidentialTransaction *this_00;
  ConfidentialNonce confidential_asset_nonce;
  IssuanceParameter local_a0;
  
  this_00 = &this->transaction_;
  tx_in_index = core::ConfidentialTransaction::GetTxInIndex(this_00,txid,vout);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_asset_nonce);
  if (!is_remove_nonce) {
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_a0,asset_nonce);
    core::ConfidentialNonce::operator=(&confidential_asset_nonce,(ConfidentialNonce *)&local_a0);
    local_a0.entropy._vptr_BlindFactor = (_func_int **)&PTR__ConfidentialNonce_007356c0;
    if (local_a0.entropy.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  core::BlindFactor::BlindFactor(&__return_storage_ptr__->entropy);
  core::ConfidentialAssetId::ConfidentialAssetId(&__return_storage_ptr__->asset);
  core::ConfidentialAssetId::ConfidentialAssetId(&__return_storage_ptr__->token);
  core::ConfidentialTransaction::SetAssetReissuance
            (&local_a0,this_00,tx_in_index,amount,locking_script,&confidential_asset_nonce,
             blind_factor,entropy);
  core::BlindFactor::operator=(&__return_storage_ptr__->entropy,&local_a0.entropy);
  core::ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_a0.asset);
  core::ConfidentialAssetId::operator=(&__return_storage_ptr__->token,&local_a0.token);
  local_a0.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_a0.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.token.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_a0.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_a0.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_a0.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  if (local_a0.entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.entropy.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (is_random_sort) {
    core::ConfidentialTransaction::RandomSortTxOut(this_00);
  }
  confidential_asset_nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_007356c0;
  if (confidential_asset_nonce.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(confidential_asset_nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetReissuance(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const Script& locking_script, const ByteData& asset_nonce,
    const BlindFactor& blind_factor, const BlindFactor& entropy,
    bool is_random_sort, bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetReissuance(
      txin_index, amount, locking_script, confidential_asset_nonce,
      blind_factor, entropy);

  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}